

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# validate_manual_hostkey.c
# Opt level: O3

_Bool validate_manual_hostkey(char *key)

{
  char cVar1;
  undefined8 uVar2;
  undefined8 uVar3;
  undefined8 uVar4;
  undefined8 uVar5;
  undefined8 uVar6;
  undefined8 uVar7;
  _Bool _Var8;
  byte bVar9;
  uint uVar10;
  int iVar11;
  undefined8 in_RAX;
  size_t sVar12;
  long lVar13;
  __int32_t **pp_Var14;
  char *pcVar15;
  char *pcVar16;
  char *__s;
  char *__s_00;
  char *__s_01;
  uchar decoded [6];
  undefined8 uStack_38;
  
  uStack_38 = in_RAX;
  sVar12 = strspn(key," \t");
  if (key[sVar12] == '\0') {
LAB_0016e210:
    _Var8 = false;
  }
  else {
    __s = key + sVar12;
LAB_0016e055:
    sVar12 = strcspn(__s," \t");
    __s_00 = __s + sVar12;
    if (__s[sVar12] != '\0') {
      *__s_00 = '\0';
      __s_00 = __s_00 + 1;
    }
    _Var8 = strstartswith(__s,"SHA256:");
    if ((!_Var8) ||
       (sVar12 = strspn(__s + 7,"0123456789abcdefghijklmnopqrstuvwxyzABCDEFGHIJKLMNOPQRSTUVWXYZ+/"),
       sVar12 != 0x2b)) {
      _Var8 = strstartswith(__s,"MD5:");
      __s_01 = __s;
      if (_Var8) {
        __s_01 = __s + 4;
      }
      sVar12 = strlen(__s_01);
      pcVar15 = __s;
      pcVar16 = __s;
      if ((sVar12 == 0x2f) &&
         (sVar12 = strspn(__s_01,"0123456789abcdefABCDEF:"), __s_01[sVar12] == '\0')) {
        lVar13 = 1;
        do {
          if ((__s_01[lVar13 + -1] == ':') || (__s_01[lVar13] == ':')) goto LAB_0016e137;
          lVar13 = lVar13 + 3;
        } while (lVar13 != 0x31);
        lVar13 = 2;
        while (__s_01[lVar13] == ':') {
          lVar13 = lVar13 + 3;
          if (lVar13 == 0x2f) {
            lVar13 = 0;
            pp_Var14 = __ctype_tolower_loc();
            do {
              key[lVar13] = (char)(*pp_Var14)[__s_01[lVar13]];
              lVar13 = lVar13 + 1;
            } while (lVar13 != 0x2f);
            key[0x2f] = '\0';
            goto LAB_0016e264;
          }
        }
      }
LAB_0016e137:
      do {
        cVar1 = *pcVar16;
        if ((cVar1 != '\n') && (cVar1 != '\r')) {
          if (cVar1 == '\0') goto code_r0x0016e148;
          *pcVar15 = cVar1;
          pcVar15 = pcVar15 + 1;
        }
        pcVar16 = pcVar16 + 1;
      } while( true );
    }
    uVar2 = *(undefined8 *)__s;
    uVar3 = *(undefined8 *)(__s + 8);
    uVar4 = *(undefined8 *)(__s + 0x10);
    uVar5 = *(undefined8 *)(__s + 0x18);
    uVar6 = *(undefined8 *)(__s + 0x20);
    uVar7 = *(undefined8 *)(__s + 0x28);
    *(undefined2 *)(key + 0x30) = *(undefined2 *)(__s + 0x30);
    *(undefined8 *)(key + 0x20) = uVar6;
    *(undefined8 *)(key + 0x28) = uVar7;
    *(undefined8 *)(key + 0x10) = uVar4;
    *(undefined8 *)(key + 0x18) = uVar5;
    *(undefined8 *)key = uVar2;
    *(undefined8 *)(key + 8) = uVar3;
    key[0x32] = '\0';
LAB_0016e264:
    _Var8 = true;
  }
  return _Var8;
code_r0x0016e148:
  *pcVar15 = '\0';
  sVar12 = strlen(__s);
  if ((((8 < sVar12 && (sVar12 & 3) == 0) &&
       (sVar12 = strspn(__s,"0123456789abcdefghijklmnopqrstuvwxyzABCDEFGHIJKLMNOPQRSTUVWXYZ+/="),
       __s[sVar12] == '\0')) &&
      (uVar10 = base64_decode_atom(__s,(uchar *)((long)&uStack_38 + 2)), 2 < (int)uVar10)) &&
     (iVar11 = base64_decode_atom(__s + 4,(uchar *)((long)&uStack_38 + (ulong)uVar10 + 2)),
     3 < (int)(iVar11 + uVar10))) {
    if ((CONCAT13(uStack_38._2_1_,
                  CONCAT12(uStack_38._3_1_,CONCAT11(uStack_38._4_1_,uStack_38._5_1_))) < 0x41) &&
       (bVar9 = uStack_38._5_1_ + 6, sVar12 = strlen(__s), bVar9 / 3 <= sVar12)) {
      sVar12 = strspn(__s,"0123456789abcdefghijklmnopqrstuvwxyzABCDEFGHIJKLMNOPQRSTUVWXYZ+/=");
      memmove(key,__s,sVar12);
      key[sVar12] = '\0';
      goto LAB_0016e264;
    }
  }
  sVar12 = strspn(__s_00," \t");
  __s = __s_00 + sVar12;
  if (__s_00[sVar12] == '\0') goto LAB_0016e210;
  goto LAB_0016e055;
}

Assistant:

bool validate_manual_hostkey(char *key)
{
    char *p, *q, *r, *s;

    /*
     * Step through the string word by word, looking for a word that's
     * in one of the formats we like.
     */
    p = key;
    while ((p += strspn(p, " \t"))[0]) {
        q = p;
        p += strcspn(p, " \t");
        if (*p) *p++ = '\0';

        /*
         * Now q is our word.
         */

        if (strstartswith(q, "SHA256:")) {
            /* Test for a valid SHA256 key fingerprint. */
            r = q + 7;
            if (strspn(r, BASE64_CHARS_NOEQ) == 43) {
                memmove(key, q, 50); /* 7-char prefix + 43-char base64 */
                key[50] = '\0';
                return true;
            }
        }

        r = q;
        if (strstartswith(r, "MD5:"))
            r += 4;
        if (strlen(r) == 16*3 - 1 &&
            r[strspn(r, "0123456789abcdefABCDEF:")] == 0) {
            /*
             * Test for a valid MD5 key fingerprint. Check the colons
             * are in the right places, and if so, return the same
             * fingerprint canonicalised into lowercase.
             */
            int i;
            for (i = 0; i < 16; i++)
                if (r[3*i] == ':' || r[3*i+1] == ':')
                    goto not_fingerprint; /* sorry */
            for (i = 0; i < 15; i++)
                if (r[3*i+2] != ':')
                    goto not_fingerprint; /* sorry */
            for (i = 0; i < 16*3 - 1; i++)
                key[i] = tolower(r[i]);
            key[16*3 - 1] = '\0';
            return true;
        }
      not_fingerprint:;

        /*
         * Before we check for a public-key blob, trim newlines out of
         * the middle of the word, in case someone's managed to paste
         * in a public-key blob _with_ them.
         */
        for (r = s = q; *r; r++)
            if (*r != '\n' && *r != '\r')
                *s++ = *r;
        *s = '\0';

        if (strlen(q) % 4 == 0 && strlen(q) > 2*4 &&
            q[strspn(q, BASE64_CHARS_ALL)] == 0) {
            /*
             * Might be a base64-encoded SSH-2 public key blob. Check
             * that it starts with a sensible algorithm string. No
             * canonicalisation is necessary for this string type.
             *
             * The algorithm string must be at most 64 characters long
             * (RFC 4251 section 6).
             */
            unsigned char decoded[6];
            unsigned alglen;
            int minlen;
            int len = 0;

            len += base64_decode_atom(q, decoded+len);
            if (len < 3)
                goto not_ssh2_blob;    /* sorry */
            len += base64_decode_atom(q+4, decoded+len);
            if (len < 4)
                goto not_ssh2_blob;    /* sorry */

            alglen = GET_32BIT_MSB_FIRST(decoded);
            if (alglen > 64)
                goto not_ssh2_blob;    /* sorry */

            minlen = ((alglen + 4) + 2) / 3;
            if (strlen(q) < minlen)
                goto not_ssh2_blob;    /* sorry */

            size_t base64_len = strspn(q, BASE64_CHARS_ALL);
            memmove(key, q, base64_len);
            key[base64_len] = '\0';
            return true;
        }
      not_ssh2_blob:;
    }

    return false;
}